

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

SuspendedRequest * __thiscall
kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::emplace<kj::HttpServer::SuspendedRequest>
          (NullableValue<kj::HttpServer::SuspendedRequest> *this,SuspendedRequest *params)

{
  if (this->isSet == true) {
    this->isSet = false;
    HttpServer::SuspendedRequest::~SuspendedRequest(&(this->field_1).value);
  }
  HttpServer::SuspendedRequest::SuspendedRequest(&(this->field_1).value,params);
  this->isSet = true;
  return (SuspendedRequest *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }